

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_struct_reader
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_result)

{
  t_field *tfield;
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar5;
  t_type *ptVar6;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  allocator local_379;
  string local_378;
  string local_358;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_338
  ;
  t_field **local_330;
  allocator local_321;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  undefined1 local_250 [8];
  t_field ffid;
  string local_198;
  undefined1 local_178 [8];
  t_field fftype;
  string local_a8;
  string local_88;
  string local_58;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  bool is_result_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_38);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"public function read($input)");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  if ((this->oop_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_58);
    poVar4 = std::operator<<(poVar4,"$xfer = 0;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_88);
    poVar4 = std::operator<<(poVar4,"$fname = null;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_a8);
    poVar4 = std::operator<<(poVar4,"$ftype = 0;");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&fftype.reference_,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&fftype.reference_);
    poVar4 = std::operator<<(poVar4,"$fid = 0;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&fftype.reference_);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_58);
    if ((this->binary_inline_ & 1U) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->readStructBegin($fname);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"while (true) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    ptVar6 = g_type_i8;
    if ((this->binary_inline_ & 1U) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->readFieldBegin($fname, $ftype, $fid);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if ($ftype == ");
      poVar4 = std::operator<<(poVar4,"TType::STOP) {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"break;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"ftype",(allocator *)&ffid.field_0xaf);
      t_field::t_field((t_field *)local_178,ptVar6,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&ffid.field_0xaf);
      ptVar6 = g_type_i16;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"fid",&local_271);
      t_field::t_field((t_field *)local_250,ptVar6,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_298,"",&local_299);
      generate_deserialize_field(this,out,(t_field *)local_178,&local_298,false);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)&local_299);
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_2c0);
      poVar4 = std::operator<<(poVar4,"if ($ftype == ");
      poVar4 = std::operator<<(poVar4,"TType::STOP) {");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2e0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_2e0);
      poVar4 = std::operator<<(poVar4,"  break;");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_300,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_300);
      poVar4 = std::operator<<(poVar4,"}");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_320,"",&local_321);
      generate_deserialize_field(this,out,(t_field *)local_250,&local_320,false);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      t_field::~t_field((t_field *)local_250);
      t_field::~t_field((t_field *)local_178);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"switch ($fid) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_330 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_38._M_current = local_330;
    while( true ) {
      local_338._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_338);
      if (!bVar1) break;
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"case ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      iVar3 = t_field::get_key(*pptVar5);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      poVar4 = std::operator<<(poVar4,":");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"if ($ftype == ");
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      ptVar6 = t_field::get_type(*pptVar5);
      type_to_enum_abi_cxx11_(&local_358,this,ptVar6);
      poVar4 = std::operator<<(poVar4,(string *)&local_358);
      poVar4 = std::operator<<(poVar4,") {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_358);
      t_generator::indent_up((t_generator *)this);
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_38);
      tfield = *pptVar5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_378,"this->",&local_379);
      generate_deserialize_field(this,out,tfield,&local_378,false);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_3a0);
      poVar4 = std::operator<<(poVar4,"} else {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3a0);
      t_generator::indent_up((t_generator *)this);
      if ((this->binary_inline_ & 1U) == 0) {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"$xfer += $input->skip($ftype);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"$xfer += TProtocol::skipBinary($input, $ftype);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
      poVar4 = std::operator<<(out,(string *)&local_3c0);
      poVar4 = std::operator<<(poVar4,"}");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_3e0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_3e0);
      poVar4 = std::operator<<(poVar4,"break;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_3c0);
      t_generator::indent_down((t_generator *)this);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_38);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"default:");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    if ((this->binary_inline_ & 1U) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->skip($ftype);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += ");
      poVar4 = std::operator<<(poVar4,"TProtocol::skipBinary($input, $ftype);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"break;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if ((this->binary_inline_ & 1U) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->readFieldEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if ((this->binary_inline_ & 1U) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$xfer += $input->readStructEnd();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    bVar1 = needs_php_read_validator(this,tstruct,is_result);
    if (bVar1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$this->_validateForRead();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"return $xfer;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_400,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_400);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_400);
  }
  else {
    bVar1 = needs_php_read_validator(this,tstruct,is_result);
    if (bVar1) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$tmp = $this->_read(\'");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar2));
      poVar4 = std::operator<<(poVar4,"\', self::$_TSPEC, $input);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"$this->_validateForRead();");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"return $tmp;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"return $this->_read(\'");
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar2));
      poVar4 = std::operator<<(poVar4,"\', self::$_TSPEC, $input);");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_struct_reader(ostream& out, t_struct* tstruct, bool is_result) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "public function read($input)" << endl;
  scope_up(out);

  if (oop_) {
    if (needs_php_read_validator(tstruct, is_result)) {
      indent(out) << "$tmp = $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
      indent(out) << "$this->_validateForRead();" << endl;
      indent(out) << "return $tmp;" << endl;
    } else {
      indent(out) << "return $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
    }
    scope_down(out);
    out << endl;
    return;
  }

  out << indent() << "$xfer = 0;" << endl << indent() << "$fname = null;" << endl << indent()
      << "$ftype = 0;" << endl << indent() << "$fid = 0;" << endl;

  // Declare stack tmp variables
  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructBegin($fname);" << endl;
  }

  // Loop over reading in fields
  indent(out) << "while (true) {" << endl;

  indent_up();

  // Read beginning field marker
  if (binary_inline_) {
    t_field fftype(g_type_i8, "ftype");
    t_field ffid(g_type_i16, "fid");
    generate_deserialize_field(out, &fftype);
    out << indent() << "if ($ftype == "
        << "TType::STOP) {" << endl << indent() << "  break;" << endl << indent() << "}" << endl;
    generate_deserialize_field(out, &ffid);
  } else {
    indent(out) << "$xfer += $input->readFieldBegin($fname, $ftype, $fid);" << endl;
    // Check for field STOP marker and break
    indent(out) << "if ($ftype == "
                << "TType::STOP) {" << endl;
    indent_up();
    indent(out) << "break;" << endl;
    indent_down();
    indent(out) << "}" << endl;
  }

  // Switch statement on the field we are reading
  indent(out) << "switch ($fid) {" << endl;

  indent_up();

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ($ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, "this->");
    indent_down();
    out << indent() << "} else {" << endl;

    indent_up();
    if (binary_inline_) {
      indent(out) << "$xfer += TProtocol::skipBinary($input, $ftype);" << endl;
    } else {
      indent(out) << "$xfer += $input->skip($ftype);" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;

  indent_up();
  if (binary_inline_) {
    indent(out) << "$xfer += "
                << "TProtocol::skipBinary($input, $ftype);" << endl;
  } else {
    indent(out) << "$xfer += $input->skip($ftype);" << endl;
  }
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  if (!binary_inline_) {
    // Read field end marker
    indent(out) << "$xfer += $input->readFieldEnd();" << endl;
  }

  scope_down(out);

  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructEnd();" << endl;
  }

  if (needs_php_read_validator(tstruct, is_result)) {
    indent(out) << "$this->_validateForRead();" << endl;
  }

  indent(out) << "return $xfer;" << endl;

  indent_down();
  out << indent() << "}" << endl;
}